

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::SpectrumBilerpTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumBilerpTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::TextureMapping2DHandle_const&,pbrt::SpectrumHandle_const&,pbrt::SpectrumHandle_const&,pbrt::SpectrumHandle_const&,pbrt::SpectrumHandle_const&>
            (__return_storage_ptr__,
             "[ SpectrumBilerpTexture mapping: %s v00: %s v01: %s v10: %s v11: %s ]",&this->mapping,
             &this->v00,&this->v01,&this->v10,&this->v11);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumBilerpTexture::ToString() const {
    return StringPrintf(
        "[ SpectrumBilerpTexture mapping: %s v00: %s v01: %s v10: %s v11: %s ]", mapping,
        v00, v01, v10, v11);
}